

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

bool google::protobuf::internal::AllAreInitialized<google::protobuf::EnumValueDescriptorProto>
               (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *t)

{
  bool bVar1;
  const_reference this;
  int local_1c;
  int i;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *t_local;
  
  local_1c = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::size(t);
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return true;
    }
    this = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Get(t,local_1c);
    bVar1 = EnumValueDescriptorProto::IsInitialized(this);
  } while (bVar1);
  return false;
}

Assistant:

bool AllAreInitialized(const RepeatedPtrField<Msg>& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}